

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_stack_extend(void **start,void **top,void **end)

{
  void *pvVar1;
  void *new_start;
  void **end_local;
  void **top_local;
  void **start_local;
  
  if ((long)*end - (long)*start < 0x3fffffff) {
    pvVar1 = yaml_realloc(*start,((long)*end - (long)*start) * 2);
    if (pvVar1 == (void *)0x0) {
      start_local._4_4_ = 0;
    }
    else {
      *top = (void *)((long)pvVar1 + ((long)*top - (long)*start));
      *end = (void *)((long)pvVar1 + ((long)*end - (long)*start) * 2);
      *start = pvVar1;
      start_local._4_4_ = 1;
    }
  }
  else {
    start_local._4_4_ = 0;
  }
  return start_local._4_4_;
}

Assistant:

YAML_DECLARE(int)
yaml_stack_extend(void **start, void **top, void **end)
{
    void *new_start;

    if ((char *)*end - (char *)*start >= INT_MAX / 2)
	return 0;

    new_start = yaml_realloc(*start, ((char *)*end - (char *)*start)*2);

    if (!new_start) return 0;

    *top = (char *)new_start + ((char *)*top - (char *)*start);
    *end = (char *)new_start + ((char *)*end - (char *)*start)*2;
    *start = new_start;

    return 1;
}